

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::
         FullClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,bool is_descriptor)

{
  undefined1 local_58 [8];
  Options options;
  bool is_descriptor_local;
  Descriptor *desc_local;
  
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       is_descriptor;
  Options::Options((Options *)local_58);
  local_58[0] = (bool)(options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count._7_1_ & 1);
  FullClassName<google::protobuf::Descriptor>(__return_storage_ptr__,desc,(Options *)local_58);
  Options::~Options((Options *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, bool is_descriptor) {
  Options options;
  options.is_descriptor = is_descriptor;
  return FullClassName(desc, options);
}